

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O2

void __thiscall spvtools::opt::SENode::DumpDot(SENode *this,ostream *out,bool recurse)

{
  pointer ppSVar1;
  SENode *this_00;
  int iVar2;
  ostream *poVar3;
  pointer ppSVar4;
  size_t child_unique_id;
  string local_50;
  
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  poVar3 = std::operator<<(poVar3," [label=\"");
  AsString_abi_cxx11_(&local_50,this);
  poVar3 = std::operator<<(poVar3,(string *)&local_50);
  std::operator<<(poVar3," ");
  std::__cxx11::string::_M_dispose();
  iVar2 = (**this->_vptr_SENode)(this);
  if (iVar2 == 0) {
    poVar3 = std::operator<<(out,"\nwith value: ");
    (*this->_vptr_SENode[5])(this);
    std::ostream::_M_insert<long>((long)poVar3);
  }
  std::operator<<(out,"\"]\n");
  ppSVar1 = (this->children_).
            super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar4 = (this->children_).
                 super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar4 != ppSVar1;
      ppSVar4 = ppSVar4 + 1) {
    this_00 = *ppSVar4;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    poVar3 = std::operator<<(poVar3," -> ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," \n");
    if (recurse) {
      DumpDot(this_00,out,true);
    }
  }
  return;
}

Assistant:

void SENode::DumpDot(std::ostream& out, bool recurse) const {
  size_t unique_id = std::hash<const SENode*>{}(this);
  out << unique_id << " [label=\"" << AsString() << " ";
  if (GetType() == SENode::Constant) {
    out << "\nwith value: " << this->AsSEConstantNode()->FoldToSingleValue();
  }
  out << "\"]\n";
  for (const SENode* child : children_) {
    size_t child_unique_id = std::hash<const SENode*>{}(child);
    out << unique_id << " -> " << child_unique_id << " \n";
    if (recurse) child->DumpDot(out, true);
  }
}